

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O1

void __thiscall relive::Player::~Player(Player *this)

{
  this->_vptr_Player = (_func_int **)&PTR__Player_003d7420;
  LOCK();
  (((this->_impl)._M_t.
    super___uniq_ptr_impl<relive::Player::impl,_std::default_delete<relive::Player::impl>_>._M_t.
    super__Tuple_impl<0UL,_relive::Player::impl_*,_std::default_delete<relive::Player::impl>_>.
    super__Head_base<0UL,_relive::Player::impl_*,_false>._M_head_impl)->_isRunning)._M_base._M_i =
       false;
  UNLOCK();
  std::thread::join();
  disableAudio(this);
  ma_context_uninit(&((this->_impl)._M_t.
                      super___uniq_ptr_impl<relive::Player::impl,_std::default_delete<relive::Player::impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_relive::Player::impl_*,_std::default_delete<relive::Player::impl>_>
                      .super__Head_base<0UL,_relive::Player::impl_*,_false>._M_head_impl)->
                     _maContext);
  std::unique_ptr<relive::Player::impl,_std::default_delete<relive::Player::impl>_>::~unique_ptr
            (&this->_impl);
  return;
}

Assistant:

Player::~Player()
{
    _impl->_isRunning = false;
    _impl->_worker.join();
    disableAudio();
    ma_context_uninit(&_impl->_maContext);
}